

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

void __thiscall
embree::SceneGraph::AnimatedLightNode::AnimatedLightNode
          (AnimatedLightNode *this,
          vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
          *lights,BBox1f time_range)

{
  LightNode *in_RDI;
  size_type in_XMM0_Qa;
  vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
  *in_stack_00000018;
  
  LightNode::LightNode(in_RDI);
  (in_RDI->super_Node).super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__AnimatedLightNode_005e7820;
  std::
  vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
  ::vector(lights,in_stack_00000018);
  in_RDI[1].super_Node.fileName._M_string_length = in_XMM0_Qa;
  return;
}

Assistant:

AnimatedLightNode (const std::vector<Ref<LightNode>>&& lights, BBox1f time_range)
        : lights(lights), time_range(time_range) {}